

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

int __thiscall NodeFS::GetNumberOfElements(NodeFS *this)

{
  pointer ppNVar1;
  int iVar2;
  uint uVar3;
  pointer ppNVar4;
  
  uVar3 = (uint)(this->type_ != -1);
  ppNVar1 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    iVar2 = GetNumberOfElements(*ppNVar4);
    uVar3 = uVar3 + iVar2;
  }
  return uVar3;
}

Assistant:

int NodeFS::GetNumberOfElements()
{
   int nb_elements = 0;
   if (type_ != -1) nb_elements++;
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      nb_elements += (*it)->GetNumberOfElements();
   }
   return nb_elements;
}